

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json_options_common<wchar_t>::basic_json_options_common
          (basic_json_options_common<wchar_t> *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__basic_json_options_common_0133df40;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfffe;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfffd;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfffb;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfff7;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xffef;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xffdf;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xffbf;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xff7f;
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xfeff;
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 2));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 6));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 10));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0xe));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x12));
  std::__cxx11::wstring::wstring((wstring *)(in_RDI + 0x16));
  *(undefined4 *)(in_RDI + 0x1a) = 0x400;
  return;
}

Assistant:

basic_json_options_common()
       :
        enable_nan_to_num_(false),
        enable_inf_to_num_(false),
        enable_neginf_to_num_(false),
        enable_nan_to_str_(false),
        enable_inf_to_str_(false),
        enable_neginf_to_str_(false),
        enable_str_to_nan_(false),
        enable_str_to_inf_(false),
        enable_str_to_neginf_(false),
        max_nesting_depth_(1024)
    {}